

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object_Advanced::Set_Demons(Am_Object_Advanced *this,Am_Demon_Set *methods)

{
  Am_Demon_Set_Data *pAVar1;
  Am_Demon_Set *methods_local;
  Am_Object_Advanced *this_local;
  
  if ((this->super_Am_Object).data == (Am_Object_Data *)0x0) {
    Am_Error("** Set_Demons called on a (0L) object.");
  }
  Am_Demon_Set_Data::Release(((this->super_Am_Object).data)->demon_set);
  pAVar1 = Am_Demon_Set::operator_cast_to_Am_Demon_Set_Data_(methods);
  ((this->super_Am_Object).data)->demon_set = pAVar1;
  Am_Demon_Set_Data::Note_Reference(((this->super_Am_Object).data)->demon_set);
  return;
}

Assistant:

void
Am_Object_Advanced::Set_Demons(const Am_Demon_Set &methods)
{
  if (!data)
    Am_Error("** Set_Demons called on a (0L) object.");
  data->demon_set->Release();
  data->demon_set = methods;
  data->demon_set->Note_Reference();
}